

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object_history.cpp
# Opt level: O0

bool __thiscall
ON_HistoryRecord::GetPolyEdgeValue
          (ON_HistoryRecord *this,int value_id,ON_PolyEdgeHistory **polyedge)

{
  int iVar1;
  ON_Value *pOVar2;
  ON_PolyEdgeHistory *pOVar3;
  ON_PolyEdgeHistoryValue *v;
  bool rc;
  ON_PolyEdgeHistory **polyedge_local;
  int value_id_local;
  ON_HistoryRecord *this_local;
  
  v._7_1_ = false;
  *polyedge = (ON_PolyEdgeHistory *)0x0;
  pOVar2 = FindValueHelper(this,value_id,0xd,false);
  if (pOVar2 != (ON_Value *)0x0) {
    iVar1 = ON_ClassArray<ON_PolyEdgeHistory>::Count
                      ((ON_ClassArray<ON_PolyEdgeHistory> *)(pOVar2 + 1));
    if (iVar1 == 1) {
      pOVar3 = ON_ClassArray<ON_PolyEdgeHistory>::operator[]
                         ((ON_ClassArray<ON_PolyEdgeHistory> *)(pOVar2 + 1),0);
      *polyedge = pOVar3;
      v._7_1_ = true;
    }
  }
  return v._7_1_;
}

Assistant:

bool ON_HistoryRecord::GetPolyEdgeValue( int value_id, const ON_PolyEdgeHistory*& polyedge ) const
{
  bool rc = false;
  polyedge = 0;
  const ON_PolyEdgeHistoryValue* v = static_cast<ON_PolyEdgeHistoryValue*>(FindValueHelper(value_id,ON_Value::polyedge_value,0));
  if ( v && 1 == v->m_value.Count())
  {
    polyedge = &v->m_value[0];
    rc = true;
  }
  return rc;
}